

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::torrent::create_peer_connection
          (torrent *this,torrent_peer *peerinfo,socket_type *socket,endpoint *endpoint)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  session_interface *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  session_settings *sett;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  element_type *peVar5;
  element_type *peVar6;
  size_type sVar7;
  element_type *peVar8;
  pointer this_01;
  pair<std::_Rb_tree_const_iterator<libtorrent::digest32<160L>_>,_bool> pVar9;
  peer_connection_interface *local_3a0;
  exception *anon_var_0;
  shared_ptr<libtorrent::aux::peer_connection> local_2f8;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  shared_ptr<libtorrent::peer_plugin> local_2d8;
  undefined1 local_2c8 [48];
  undefined1 local_298 [8];
  shared_ptr<libtorrent::peer_plugin> pp;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2;
  undefined1 local_258 [8];
  shared_ptr<libtorrent::aux::bt_peer_connection> c;
  undefined1 local_238 [8];
  peer_connection_args pack;
  peer_id our_pid;
  endpoint *endpoint_local;
  socket_type *socket_local;
  torrent_peer *peerinfo_local;
  torrent *this_local;
  
  sett = settings(this);
  generate_peer_id((peer_id *)&pack.field_0x1ec,sett);
  local_238 = (undefined1  [8])(this->super_torrent_hot_members).m_ses;
  pack.ses = (session_interface *)settings(this);
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x4b])();
  pack.sett = (session_settings *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [4])();
  pack.stats_counters = (counters *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [7])();
  pack.disk_thread = (disk_interface *)CONCAT44(extraout_var_01,iVar3);
  this_00 = &c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
            ((enable_shared_from_this<libtorrent::aux::torrent> *)this_00);
  ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
            ((weak_ptr<libtorrent::aux::torrent> *)&pack.ios,
             (shared_ptr<libtorrent::aux::torrent> *)this_00);
  polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
  ::polymorphic_socket
            ((polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              *)&pack.tor.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,socket);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)
             &pack.s.
              super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              .
              super__Variant_base<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              .
              super__Move_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              .
              super__Copy_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              .
              super__Move_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              .
              super__Copy_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              .
              super__Variant_storage_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              ._M_index,endpoint);
  pack.peerinfo = stack0xffffffffffffffbc;
  pack._456_8_ = peerinfo;
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)this_00);
  ::std::make_shared<libtorrent::aux::bt_peer_connection,libtorrent::aux::peer_connection_args&>
            ((peer_connection_args *)local_258);
  peVar5 = ::std::
           __shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_258);
  (*(peVar5->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xf])
            (peVar5,(ulong)peerinfo->prev_amount_download << 10,
             (ulong)peerinfo->prev_amount_upload << 10);
  peerinfo->prev_amount_download = 0;
  peerinfo->prev_amount_upload = 0;
  __end2 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
           ::begin(&this->m_extensions);
  ext = (shared_ptr<libtorrent::torrent_plugin> *)
        ::std::__cxx11::
        list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
        ::end(&this->m_extensions);
  while (bVar2 = ::std::operator!=(&__end2,(_Self *)&ext), bVar2) {
    pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*(&__end2);
    peVar6 = ::std::
             __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pp.
                             super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
    ::std::
    __shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_258);
    peer_connection::self((peer_connection *)local_2c8);
    ::std::weak_ptr<libtorrent::aux::peer_connection>::
    weak_ptr<libtorrent::aux::peer_connection,void>
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_2c8 + 0x10),
               (shared_ptr<libtorrent::aux::peer_connection> *)local_2c8);
    peer_connection_handle::peer_connection_handle
              ((peer_connection_handle *)(local_2c8 + 0x20),
               (weak_ptr<libtorrent::aux::peer_connection> *)(local_2c8 + 0x10));
    (*peVar6->_vptr_torrent_plugin[2])(local_298,peVar6,local_2c8 + 0x20);
    peer_connection_handle::~peer_connection_handle((peer_connection_handle *)(local_2c8 + 0x20));
    ::std::weak_ptr<libtorrent::aux::peer_connection>::~weak_ptr
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_2c8 + 0x10));
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)local_2c8);
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_298);
    if (bVar2) {
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_258);
      ::std::shared_ptr<libtorrent::peer_plugin>::shared_ptr
                (&local_2d8,(shared_ptr<libtorrent::peer_plugin> *)local_298);
      peer_connection::add_extension(&peVar5->super_peer_connection,&local_2d8);
      ::std::shared_ptr<libtorrent::peer_plugin>::~shared_ptr(&local_2d8);
    }
    ::std::shared_ptr<libtorrent::peer_plugin>::~shared_ptr
              ((shared_ptr<libtorrent::peer_plugin> *)local_298);
    ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2);
  }
  sVar7 = ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::size(&(this->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                );
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::reserve(&this->m_peers_to_disconnect,sVar7 + 1);
  peVar8 = ::std::__shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>
                       *)local_258);
  sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::bt_peer_connection*>
            (&(this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ,peVar8);
  pVar9 = ::std::
          set<libtorrent::digest32<160L>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
          ::insert(&this->m_outgoing_pids,(value_type *)&pack.field_0x1ec);
  local_2e8 = (_Base_ptr)pVar9.first._M_node;
  local_2e0 = pVar9.second;
  psVar1 = (this->super_torrent_hot_members).m_ses;
  ::std::shared_ptr<libtorrent::aux::peer_connection>::
  shared_ptr<libtorrent::aux::bt_peer_connection,void>
            (&local_2f8,(shared_ptr<libtorrent::aux::bt_peer_connection> *)local_258);
  (*(psVar1->super_session_logger)._vptr_session_logger[10])(psVar1,&local_2f8);
  ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr(&local_2f8);
  need_peer_list(this);
  this_01 = ::std::
            unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
            ::operator->(&(this->super_torrent_hot_members).m_peer_list);
  peVar8 = ::std::__shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>
                       *)local_258);
  local_3a0 = (peer_connection_interface *)0x0;
  if (peVar8 != (element_type *)0x0) {
    local_3a0 = &(peVar8->super_peer_connection).super_peer_connection_interface;
  }
  peer_list::set_connection(this_01,peerinfo,local_3a0);
  if ((*(uint *)&peerinfo->field_0x1b >> 7 & 1) != 0) {
    this->m_num_seeds = this->m_num_seeds + 1;
  }
  update_want_peers(this);
  update_want_tick(this);
  peVar5 = ::std::
           __shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_258);
  (*(peVar5->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[5])();
  peVar5 = ::std::
           __shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_258);
  uVar4 = (*(peVar5->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((uVar4 & 1) == 0) {
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d & 1) != 0) {
      recalc_share_mode(this);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  ::std::shared_ptr<libtorrent::aux::bt_peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::bt_peer_connection> *)local_258);
  peer_connection_args::~peer_connection_args((peer_connection_args *)local_238);
  return this_local._7_1_;
}

Assistant:

bool torrent::create_peer_connection(torrent_peer* peerinfo, aux::socket_type socket, tcp::endpoint endpoint)
	{
		peer_id const our_pid = aux::generate_peer_id(settings());
		peer_connection_args pack{
			&m_ses
			, &settings()
			, &m_ses.stats_counters()
			, &m_ses.disk_thread()
			, &m_ses.get_context()
			, shared_from_this()
			, std::move(socket)
			, std::move(endpoint)
			, peerinfo
			, our_pid
		};

		auto c = std::make_shared<bt_peer_connection>(pack);

#if TORRENT_USE_ASSERTS
		c->m_in_constructor = false;
#endif

		c->add_stat(std::int64_t(peerinfo->prev_amount_download) * 1024
			, std::int64_t(peerinfo->prev_amount_upload) * 1024);
		peerinfo->prev_amount_download = 0;
		peerinfo->prev_amount_upload = 0;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			std::shared_ptr<peer_plugin> pp(ext->new_connection(
					peer_connection_handle(c->self())));
			if (pp) c->add_extension(pp);
		}
#endif

		// add the newly connected peer to this torrent's peer list
		TORRENT_ASSERT(m_iterating_connections == 0);

		// we don't want to have to allocate memory to disconnect this peer, so
		// make sure there's enough memory allocated in the deferred_disconnect
		// list up-front
		m_peers_to_disconnect.reserve(m_connections.size() + 1);

		sorted_insert(m_connections, c.get());
		try
		{
			m_outgoing_pids.insert(our_pid);
			m_ses.insert_peer(c);
			need_peer_list();
			m_peer_list->set_connection(peerinfo, c.get());
			if (peerinfo->seed)
			{
				TORRENT_ASSERT(m_num_seeds < 0xffff);
				++m_num_seeds;
			}
			update_want_peers();
			update_want_tick();
			c->start();

			if (c->is_disconnecting()) return false;
		}
		catch (std::exception const&)
		{
			TORRENT_ASSERT(m_iterating_connections == 0);
			c->disconnect(errors::no_error, operation_t::bittorrent, peer_connection_interface::failure);
			return false;
		}

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode)
			recalc_share_mode();
#endif
		return true;
	}